

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.cpp
# Opt level: O1

void __thiscall
sf::Shader::setUniformArray(Shader *this,string *name,Mat3 *matrixArray,size_t length)

{
  size_t sVar1;
  long lVar2;
  UniformBinder binder;
  vector<float,_std::allocator<float>_> contiguous;
  UniformBinder UStack_58;
  vector<float,_std::allocator<float>_> local_48;
  
  std::vector<float,_std::allocator<float>_>::vector
            (&local_48,length * 9,(allocator_type *)&UStack_58);
  if (length != 0) {
    lVar2 = 0;
    sVar1 = length;
    do {
      priv::copyMatrix((float *)(matrixArray + lVar2),9,
                       (float *)((long)local_48.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start + lVar2));
      lVar2 = lVar2 + 0x24;
      sVar1 = sVar1 - 1;
    } while (sVar1 != 0);
  }
  UniformBinder::UniformBinder(&UStack_58,this,name);
  if (UStack_58.location != -1) {
    (*sf_ptrc_glUniformMatrix3fvARB)
              (UStack_58.location,(GLsizei)length,'\0',
               local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
    priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Shader.cpp"
                       ,0x284,
                       "GLEXT_glUniformMatrix3fv(binder.location, static_cast<GLsizei>(length), GL_FALSE, &contiguous[0])"
                      );
  }
  UniformBinder::~UniformBinder(&UStack_58);
  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (GLfloat *)0x0) {
    operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Shader::setUniformArray(const std::string& name, const Glsl::Mat3* matrixArray, std::size_t length)
{
    const std::size_t matrixSize = 3 * 3;

    std::vector<float> contiguous(matrixSize * length);
    for (std::size_t i = 0; i < length; ++i)
        priv::copyMatrix(matrixArray[i].array, matrixSize, &contiguous[matrixSize * i]);

    UniformBinder binder(*this, name);
    if (binder.location != -1)
        glCheck(GLEXT_glUniformMatrix3fv(binder.location, static_cast<GLsizei>(length), GL_FALSE, &contiguous[0]));
}